

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

uint8_t * __thiscall
google::protobuf::SourceCodeInfo_Location::_InternalSerialize
          (SourceCodeInfo_Location *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  RepeatedField<int> *this_00;
  int *piVar1;
  size_t __n;
  bool bVar2;
  anon_union_96_1_493b367e_for_SourceCodeInfo_Location_3 aVar3;
  int iVar4;
  int *piVar5;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar6;
  uint8_t *puVar7;
  byte *extraout_RAX;
  byte *pbVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  int index;
  char *in_R9;
  LongSooRep *unaff_R13;
  undefined8 *puVar13;
  string_view s;
  string_view s_00;
  string_view s_01;
  string_view field_name;
  string_view field_name_00;
  string_view field_name_01;
  
  uVar11 = *(uint *)((long)&this->field_0 + 0x18);
  if ((int)uVar11 < 1) {
LAB_001ae996:
    uVar12 = *(uint *)((long)&this->field_0 + 0x30);
    if ((int)uVar12 < 1) goto LAB_001aea5c;
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    if (stream->end_ <= target) {
      _InternalSerialize();
    }
    unaff_R13 = (LongSooRep *)&(this->field_0)._impl_.span_;
    *target = 0x12;
    pbVar8 = target + 1;
    uVar11 = uVar12;
    if (0x7f < uVar12) goto LAB_001aec1a;
  }
  else {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    if (target < stream->end_) {
      this_00 = &(this->field_0)._impl_.path_;
      *target = 10;
      pbVar8 = target + 1;
      uVar12 = uVar11;
      if (0x7f < uVar11) {
        do {
          target = pbVar8;
          *target = (byte)uVar12 | 0x80;
          uVar11 = uVar12 >> 7;
          pbVar8 = target + 1;
          bVar2 = 0x3fff < uVar12;
          uVar12 = uVar11;
        } while (bVar2);
      }
      *pbVar8 = (byte)uVar11;
      if ((undefined1  [16])((undefined1  [16])(this_00->soo_rep_).field_0 & (undefined1  [16])0x4)
          == (undefined1  [16])0x0) {
        piVar5 = (int *)((long)&this->field_0 + 0x10);
      }
      else {
        piVar5 = (int *)internal::LongSooRep::elements((LongSooRep *)this_00);
      }
      target = target + 2;
      iVar4 = internal::SooRep::size
                        (&this_00->soo_rep_,
                         (undefined1  [16])
                         ((undefined1  [16])(this_00->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                         (undefined1  [16])0x0);
      piVar1 = piVar5 + iVar4;
      do {
        if (stream->end_ <= target) {
          target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        uVar9 = (ulong)*piVar5;
        uVar10 = uVar9;
        if (0x7f < uVar9) {
          do {
            *target = (byte)uVar10 | 0x80;
            uVar9 = uVar10 >> 7;
            target = target + 1;
            bVar2 = 0x3fff < uVar10;
            uVar10 = uVar9;
          } while (bVar2);
        }
        piVar5 = piVar5 + 1;
        *target = (byte)uVar9;
        target = target + 1;
      } while (piVar5 < piVar1);
      goto LAB_001ae996;
    }
    _InternalSerialize();
    pbVar8 = extraout_RAX;
LAB_001aec1a:
    do {
      target = pbVar8;
      *target = (byte)uVar11 | 0x80;
      uVar12 = uVar11 >> 7;
      pbVar8 = target + 1;
      bVar2 = 0x3fff < uVar11;
      uVar11 = uVar12;
    } while (bVar2);
  }
  *pbVar8 = (byte)uVar12;
  if ((unaff_R13->elements_int & 4) == 0) {
    piVar5 = (int *)((long)&this->field_0 + 0x28);
  }
  else {
    piVar5 = (int *)internal::LongSooRep::elements(unaff_R13);
  }
  target = target + 2;
  iVar4 = internal::SooRep::size((SooRep *)unaff_R13,(unaff_R13->elements_int & 4) == 0);
  piVar1 = piVar5 + iVar4;
  do {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar9 = (ulong)*piVar5;
    uVar10 = uVar9;
    if (0x7f < uVar9) {
      do {
        *target = (byte)uVar10 | 0x80;
        uVar9 = uVar10 >> 7;
        target = target + 1;
        bVar2 = 0x3fff < uVar10;
        uVar10 = uVar9;
      } while (bVar2);
    }
    piVar5 = piVar5 + 1;
    *target = (byte)uVar9;
    target = target + 1;
  } while (piVar5 < piVar1);
LAB_001aea5c:
  aVar3 = this->field_0;
  if (((undefined1  [96])aVar3 & (undefined1  [96])0x1) != (undefined1  [96])0x0) {
    puVar13 = (undefined8 *)
              ((ulong)(this->field_0)._impl_.leading_comments_.tagged_ptr_.ptr_ & 0xfffffffffffffffc
              );
    field_name._M_str = in_R9;
    field_name._M_len = (size_t)"google.protobuf.SourceCodeInfo.Location.leading_comments";
    internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)*puVar13,(char *)(ulong)*(uint *)(puVar13 + 1),1,0x38,field_name);
    s._M_str = (char *)*puVar13;
    s._M_len = puVar13[1];
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,3,s,target);
  }
  if (((undefined1  [96])aVar3 & (undefined1  [96])0x2) != (undefined1  [96])0x0) {
    puVar13 = (undefined8 *)
              ((ulong)(this->field_0)._impl_.trailing_comments_.tagged_ptr_.ptr_ &
              0xfffffffffffffffc);
    field_name_00._M_str = in_R9;
    field_name_00._M_len = (size_t)"google.protobuf.SourceCodeInfo.Location.trailing_comments";
    internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)*puVar13,(char *)(ulong)*(uint *)(puVar13 + 1),1,0x39,field_name_00
              );
    s_00._M_str = (char *)*puVar13;
    s_00._M_len = puVar13[1];
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,4,s_00,target);
  }
  iVar4 = *(int *)((long)&this->field_0 + 0x40);
  if (0 < iVar4) {
    index = 0;
    do {
      pVVar6 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                         (&(this->field_0)._impl_.leading_detached_comments_.
                           super_RepeatedPtrFieldBase,index);
      field_name_01._M_str = in_R9;
      field_name_01._M_len =
           (size_t)"google.protobuf.SourceCodeInfo.Location.leading_detached_comments";
      internal::WireFormatLite::VerifyUtf8String
                ((WireFormatLite *)(pVVar6->_M_dataplus)._M_p,
                 (char *)(ulong)(uint)pVVar6->_M_string_length,1,0x41,field_name_01);
      __n = pVVar6->_M_string_length;
      if (((long)__n < 0x80) && ((long)__n <= (long)(stream->end_ + (0xe - (long)target)))) {
        *target = 0x32;
        target[1] = (byte)__n;
        memcpy(target + 2,(pVVar6->_M_dataplus)._M_p,__n);
        target = target + __n + 2;
      }
      else {
        s_01._M_str = (pVVar6->_M_dataplus)._M_p;
        s_01._M_len = __n;
        target = io::EpsCopyOutputStream::WriteStringOutline(stream,6,s_01,target);
      }
      index = index + 1;
    } while (iVar4 != index);
  }
  uVar10 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar10 & 1) != 0) {
    puVar7 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((uVar10 & 0xfffffffffffffffe) + 8),target,stream);
    return puVar7;
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL SourceCodeInfo_Location::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const SourceCodeInfo_Location& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.SourceCodeInfo.Location)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // repeated int32 path = 1 [packed = true];
  {
    int byte_size = this_._impl_._path_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          1, this_._internal_path(), byte_size, target);
    }
  }

  // repeated int32 span = 2 [packed = true];
  {
    int byte_size = this_._impl_._span_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          2, this_._internal_span(), byte_size, target);
    }
  }

  cached_has_bits = this_._impl_._has_bits_[0];
  // optional string leading_comments = 3;
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::std::string& _s = this_._internal_leading_comments();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.SourceCodeInfo.Location.leading_comments");
    target = stream->WriteStringMaybeAliased(3, _s, target);
  }

  // optional string trailing_comments = 4;
  if ((cached_has_bits & 0x00000002u) != 0) {
    const ::std::string& _s = this_._internal_trailing_comments();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.SourceCodeInfo.Location.trailing_comments");
    target = stream->WriteStringMaybeAliased(4, _s, target);
  }

  // repeated string leading_detached_comments = 6;
  for (int i = 0, n = this_._internal_leading_detached_comments_size(); i < n; ++i) {
    const auto& s = this_._internal_leading_detached_comments().Get(i);
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(s.data(), static_cast<int>(s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.SourceCodeInfo.Location.leading_detached_comments");
    target = stream->WriteString(6, s, target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.SourceCodeInfo.Location)
  return target;
}